

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void CLI::detail::remove_default_flag_values(string *flags)

{
  size_type sVar1;
  reference pvVar2;
  iterator __last;
  iterator this;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_type finish;
  size_type loc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff70;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  __const_iterator in_stack_ffffffffffffff90;
  __const_iterator in_stack_ffffffffffffff98;
  undefined8 local_10;
  
  local_10 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             find_first_of(in_stack_ffffffffffffff60,
                           (char)((ulong)in_stack_ffffffffffffff58 >> 0x38),0x38b586);
  while (local_10 != 0xffffffffffffffff) {
    sVar1 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff78._M_current,
                          (size_type)in_stack_ffffffffffffff70._M_current);
    if (sVar1 != 0xffffffffffffffff) {
      pvVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](in_stack_ffffffffffffff60,(size_type)in_stack_ffffffffffffff58);
      if (*pvVar2 == '}') {
        in_stack_ffffffffffffff60 = in_RDI;
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                  (in_stack_ffffffffffffff58);
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_ffffffffffffff68,(difference_type)in_stack_ffffffffffffff60);
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffff60,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffff58);
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                  (in_stack_ffffffffffffff58);
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_ffffffffffffff68,(difference_type)in_stack_ffffffffffffff60);
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator+((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_ffffffffffffff68,(difference_type)in_stack_ffffffffffffff60);
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffff60,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_ffffffffffffff58);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  (in_stack_ffffffffffffff88,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      }
    }
    local_10 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               find_first_of(in_stack_ffffffffffffff60,
                             (char)((ulong)in_stack_ffffffffffffff58 >> 0x38),0x38b6c9);
  }
  __last = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                     (in_RDI);
  this = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                   (in_stack_ffffffffffffff68);
  __first = ::std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                      (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                       (char *)in_stack_ffffffffffffff68);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffff60,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_RDI);
  ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
            (in_stack_ffffffffffffff68);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffff60,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_RDI);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this._M_current,
             (__const_iterator)__first._M_current,(__const_iterator)__last._M_current);
  return;
}

Assistant:

CLI11_INLINE void remove_default_flag_values(std::string &flags) {
    auto loc = flags.find_first_of('{', 2);
    while(loc != std::string::npos) {
        auto finish = flags.find_first_of("},", loc + 1);
        if((finish != std::string::npos) && (flags[finish] == '}')) {
            flags.erase(flags.begin() + static_cast<std::ptrdiff_t>(loc),
                        flags.begin() + static_cast<std::ptrdiff_t>(finish) + 1);
        }
        loc = flags.find_first_of('{', loc + 1);
    }
    flags.erase(std::remove(flags.begin(), flags.end(), '!'), flags.end());
}